

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_status(lysp_yin_ctx *ctx,uint16_t *flags,lysp_ext_instance **exts)

{
  int iVar1;
  ly_ctx *local_70;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  yin_subelement subelems [1];
  char *local_38;
  char *value;
  lysp_ext_instance **exts_local;
  uint16_t *flags_local;
  lysp_yin_ctx *ctx_local;
  
  local_38 = (char *)0x0;
  ret___1 = LY_STMT_EXTENSION_INSTANCE;
  ret__ = 0;
  subelems[0].type = LY_STMT_NONE;
  subelems[0]._4_4_ = 0;
  subelems[0].dest = (void *)0x0;
  value = (char *)exts;
  exts_local = (lysp_ext_instance **)flags;
  flags_local = (uint16_t *)ctx;
  ctx_local._4_4_ = lyxml_ctx_next(ctx->xmlctx);
  if ((ctx_local._4_4_ == LY_SUCCESS) &&
     (ctx_local._4_4_ =
           yin_parse_attribute((lysp_yin_ctx *)flags_local,YIN_ARG_VALUE,&local_38,Y_STR_ARG,
                               LY_STMT_STATUS), ctx_local._4_4_ == LY_SUCCESS)) {
    iVar1 = strcmp(local_38,"current");
    if (iVar1 == 0) {
      *(ushort *)exts_local = *(ushort *)exts_local | 4;
    }
    else {
      iVar1 = strcmp(local_38,"deprecated");
      if (iVar1 == 0) {
        *(ushort *)exts_local = *(ushort *)exts_local | 8;
      }
      else {
        iVar1 = strcmp(local_38,"obsolete");
        if (iVar1 != 0) {
          if (flags_local == (uint16_t *)0x0) {
            local_70 = (ly_ctx *)0x0;
          }
          else {
            local_70 = *(ly_ctx **)
                        **(undefined8 **)
                          (*(long *)(*(long *)(flags_local + 0x1c) + 8) +
                          (ulong)(*(int *)(*(long *)(flags_local + 0x1c) + 4) - 1) * 8);
          }
          ly_vlog(local_70,(char *)0x0,LYVE_SYNTAX_YIN,
                  "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element. Valid values are \"%s\", \"%s\" and \"%s\"."
                  ,local_38,"value","status","current","deprecated","obsolete");
          lydict_remove((ly_ctx *)**(undefined8 **)(flags_local + 0x24),local_38);
          return LY_EVALID;
        }
        *(ushort *)exts_local = *(ushort *)exts_local | 0x10;
      }
    }
    lydict_remove((ly_ctx *)**(undefined8 **)(flags_local + 0x24),local_38);
    ctx_local._4_4_ =
         yin_parse_content((lysp_yin_ctx *)flags_local,(yin_subelement *)&ret___1,1,exts_local,
                           LY_STMT_STATUS,(char **)0x0,(lysp_ext_instance **)value);
    if (ctx_local._4_4_ == LY_SUCCESS) {
      ctx_local._4_4_ = LY_SUCCESS;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
yin_parse_status(struct lysp_yin_ctx *ctx, uint16_t *flags, struct lysp_ext_instance **exts)
{
    const char *value = NULL;
    struct yin_subelement subelems[] = {
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0}
    };

    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_VALUE, &value, Y_STR_ARG, LY_STMT_STATUS));
    if (strcmp(value, "current") == 0) {
        *flags |= LYS_STATUS_CURR;
    } else if (strcmp(value, "deprecated") == 0) {
        *flags |= LYS_STATUS_DEPRC;
    } else if (strcmp(value, "obsolete") == 0) {
        *flags |= LYS_STATUS_OBSLT;
    } else {
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_INVAL_YIN VALID_VALS3, value, "value",
                "status", "current", "deprecated", "obsolete");
        lydict_remove(ctx->xmlctx->ctx, value);
        return LY_EVALID;
    }
    lydict_remove(ctx->xmlctx->ctx, value);

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), flags, LY_STMT_STATUS, NULL, exts));

    return LY_SUCCESS;
}